

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O0

basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
jsoncons::jsonpointer::detail::
resolve<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *current,
          string_view_type *buffer,bool create_if_missing,error_code *ec)

{
  byte bVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_pointer s;
  size_t sVar5;
  pointer this;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RCX;
  byte in_DL;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RDI;
  type tVar6;
  pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
  r;
  type result;
  size_t index;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffff58;
  jsonpointer_errc __e;
  error_code *in_stack_ffffffffffffff60;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffff68;
  string_view_type *in_stack_ffffffffffffff90;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffff98;
  char *local_40;
  to_integer_errc local_38;
  ulong uVar7;
  ulong i;
  undefined7 in_stack_ffffffffffffffe0;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *local_8;
  
  bVar1 = in_DL & 1;
  bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_array
                    (in_stack_ffffffffffffff68);
  if (bVar2) {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_RSI);
    if ((sVar3 == 1) &&
       (pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](in_RSI,0),
       *pvVar4 == '-')) {
      std::error_code::operator=
                (in_stack_ffffffffffffff60,
                 (jsonpointer_errc)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      local_8 = in_RDI;
    }
    else {
      uVar7 = 0;
      s = std::basic_string_view<char,_std::char_traits<char>_>::data(in_RSI);
      std::basic_string_view<char,_std::char_traits<char>_>::length(in_RSI);
      tVar6 = jsoncons::detail::dec_to_integer<unsigned_long,char>
                        (s,(size_t)in_stack_ffffffffffffff68,
                         (unsigned_long *)in_stack_ffffffffffffff60);
      local_40 = tVar6.ptr;
      local_38 = tVar6.ec;
      bVar2 = jsoncons::detail::to_integer_result::operator_cast_to_bool
                        ((to_integer_result *)&local_40);
      if (bVar2) {
        i = uVar7;
        sVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                          (in_stack_ffffffffffffff58);
        if (uVar7 < sVar5) {
          local_8 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                              (in_RCX,i);
        }
        else {
          std::error_code::operator=
                    (in_stack_ffffffffffffff60,
                     (jsonpointer_errc)((ulong)in_stack_ffffffffffffff58 >> 0x20));
          local_8 = in_RDI;
        }
      }
      else {
        std::error_code::operator=
                  (in_stack_ffffffffffffff60,
                   (jsonpointer_errc)((ulong)in_stack_ffffffffffffff58 >> 0x20));
        local_8 = in_RDI;
      }
    }
  }
  else {
    bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_object
                      (in_stack_ffffffffffffff68);
    __e = (jsonpointer_errc)((ulong)in_stack_ffffffffffffff58 >> 0x20);
    if (bVar2) {
      bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::contains
                        (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      if (bVar2) {
        local_8 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      }
      else if ((bVar1 & 1) == 0) {
        std::error_code::operator=(in_stack_ffffffffffffff60,__e);
        local_8 = in_RDI;
      }
      else {
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                  (in_RDI);
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        try_emplace<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                  (in_RDI,in_RSI,
                   (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   CONCAT17(bVar1,in_stack_ffffffffffffffe0));
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   0x555b35);
        this = jsoncons::detail::
               random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
               ::operator->((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                             *)0x555b3f);
        local_8 = key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  ::value(this);
      }
    }
    else {
      std::error_code::operator=(in_stack_ffffffffffffff60,__e);
      local_8 = in_RDI;
    }
  }
  return local_8;
}

Assistant:

Json* resolve(Json* current, const typename Json::string_view_type& buffer, bool create_if_missing, std::error_code& ec)
    {
        if (current->is_array())
        {
            if (buffer.size() == 1 && buffer[0] == '-')
            {
                ec = jsonpointer_errc::index_exceeds_array_size;
                return current;
            }
            std::size_t index{0};
            auto result = jsoncons::detail::dec_to_integer(buffer.data(), buffer.length(), index);
            if (!result)
            {
                ec = jsonpointer_errc::invalid_index;
                return current;
            }
            if (index >= current->size())
            {
                ec = jsonpointer_errc::index_exceeds_array_size;
                return current;
            }
            current = std::addressof(current->at(index));
        }
        else if (current->is_object())
        {
            if (!current->contains(buffer))
            {
                if (create_if_missing)
                {
                    auto r = current->try_emplace(buffer, Json());
                    current = std::addressof(r.first->value());
                }
                else
                {
                    ec = jsonpointer_errc::key_not_found;
                    return current;
                }
            }
            else
            {
                current = std::addressof(current->at(buffer));
            }
        }
        else
        {
            ec = jsonpointer_errc::expected_object_or_array;
            return current;
        }
        return current;
    }